

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwSetWindowSizeLimits
               (GLFWwindow *handle,int minwidth,int minheight,int maxwidth,int maxheight)

{
  _GLFWwindow *window;
  int maxheight_local;
  int maxwidth_local;
  int minheight_local;
  int minwidth_local;
  GLFWwindow *handle_local;
  
  if (handle != (GLFWwindow *)0x0) {
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
    }
    else if (((minwidth == -1) || (minheight == -1)) || ((-1 < minwidth && (-1 < minheight)))) {
      if (((maxwidth == -1) || (maxheight == -1)) ||
         ((-1 < maxwidth &&
          (((-1 < maxheight && (minwidth <= maxwidth)) && (minheight <= maxheight)))))) {
        *(int *)(handle + 0x60) = minwidth;
        *(int *)(handle + 100) = minheight;
        *(int *)(handle + 0x68) = maxwidth;
        *(int *)(handle + 0x6c) = maxheight;
        if ((*(long *)(handle + 0x50) == 0) && (*(int *)(handle + 8) != 0)) {
          (*_glfw.platform.setWindowSizeLimits)
                    ((_GLFWwindow *)handle,minwidth,minheight,maxwidth,maxheight);
        }
      }
      else {
        _glfwInputError(0x10004,"Invalid window maximum size %ix%i",(ulong)(uint)maxwidth,
                        (ulong)(uint)maxheight);
      }
    }
    else {
      _glfwInputError(0x10004,"Invalid window minimum size %ix%i",(ulong)(uint)minwidth,
                      (ulong)(uint)minheight);
    }
    return;
  }
  __assert_fail("window != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/src/window.c",
                599,"void glfwSetWindowSizeLimits(GLFWwindow *, int, int, int, int)");
}

Assistant:

GLFWAPI void glfwSetWindowSizeLimits(GLFWwindow* handle,
                                     int minwidth, int minheight,
                                     int maxwidth, int maxheight)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (minwidth != GLFW_DONT_CARE && minheight != GLFW_DONT_CARE)
    {
        if (minwidth < 0 || minheight < 0)
        {
            _glfwInputError(GLFW_INVALID_VALUE,
                            "Invalid window minimum size %ix%i",
                            minwidth, minheight);
            return;
        }
    }

    if (maxwidth != GLFW_DONT_CARE && maxheight != GLFW_DONT_CARE)
    {
        if (maxwidth < 0 || maxheight < 0 ||
            maxwidth < minwidth || maxheight < minheight)
        {
            _glfwInputError(GLFW_INVALID_VALUE,
                            "Invalid window maximum size %ix%i",
                            maxwidth, maxheight);
            return;
        }
    }

    window->minwidth  = minwidth;
    window->minheight = minheight;
    window->maxwidth  = maxwidth;
    window->maxheight = maxheight;

    if (window->monitor || !window->resizable)
        return;

    _glfw.platform.setWindowSizeLimits(window,
                                       minwidth, minheight,
                                       maxwidth, maxheight);
}